

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

void writelonglong(char *outfile,LONGLONG a)

{
  long in_RSI;
  uchar b [8];
  int i;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar1;
  long local_10;
  
  local_10 = in_RSI;
  for (iVar1 = 7; -1 < iVar1; iVar1 = iVar1 + -1) {
    (&stack0xffffffffffffffe4)[iVar1] = (char)local_10;
    local_10 = local_10 >> 8;
  }
  for (iVar1 = 0; iVar1 < 8; iVar1 = iVar1 + 1) {
    qwrite((char *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0,
           in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

static void
writelonglong(char *outfile, LONGLONG a)
{
int i;
unsigned char b[8];

	/* Write integer A one byte at a time to outfile.
	 *
	 * This is portable from Vax to Sun since it eliminates the
	 * need for byte-swapping.
	 */
	for (i=7; i>=0; i--) {
		b[i] = (unsigned char) (a & 0x000000ff);
		a >>= 8;
	}
	for (i=0; i<8; i++) qwrite(outfile, (char *) &b[i],1);
}